

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall yy::mylanguage_parser::error(mylanguage_parser *this,syntax_error *yyexc)

{
  char *pcVar1;
  string local_48 [39];
  allocator local_21;
  
  pcVar1 = (char *)(**(code **)(*(long *)yyexc + 0x10))(yyexc);
  std::__cxx11::string::string(local_48,pcVar1,&local_21);
  (*this->_vptr_mylanguage_parser[3])(this,&yyexc->location,local_48);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void
  mylanguage_parser::error (const syntax_error& yyexc)
  {
    error (yyexc.location, yyexc.what ());
  }